

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this)

{
  undefined1 (*pauVar1) [16];
  char cVar2;
  undefined1 (*pauVar3) [16];
  size_t sVar4;
  ulong uVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  size_type sVar8;
  slot_type *psVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  byte bVar14;
  unsigned_long uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar24 [16];
  undefined1 (*pauStack_58) [16];
  undefined1 auStack_48 [16];
  int iStack_38;
  undefined1 auVar23 [64];
  
  uVar21 = this->capacity_;
  if (uVar21 == 0) {
    resize(this,1);
    return;
  }
  if (this->size_ <= uVar21 - (uVar21 >> 3) >> 1) {
    pauVar3 = (undefined1 (*) [16])this->ctrl_;
    sVar4 = this->capacity_;
    if ((undefined1 (*) [16])(*pauVar3 + sVar4 + 1) != pauVar3) {
      auVar22[8] = 0x7e;
      auVar22._0_8_ = 0x7e7e7e7e7e7e7e7e;
      auVar22[9] = 0x7e;
      auVar22[10] = 0x7e;
      auVar22[0xb] = 0x7e;
      auVar22[0xc] = 0x7e;
      auVar22[0xd] = 0x7e;
      auVar22[0xe] = 0x7e;
      auVar22[0xf] = 0x7e;
      auVar24._8_8_ = 0x8080808080808080;
      auVar24._0_8_ = 0x8080808080808080;
      lVar19 = 0;
      do {
        auVar10 = vpshufb_avx(auVar22,*(undefined1 (*) [16])(*pauVar3 + lVar19));
        auVar10 = vpor_avx(auVar10,auVar24);
        *(undefined1 (*) [16])(*pauVar3 + lVar19) = auVar10;
        lVar19 = lVar19 + 0x10;
      } while (sVar4 + 1 != lVar19);
    }
    *(undefined1 (*) [16])(*pauVar3 + sVar4 + 1) = *pauVar3;
    (*pauVar3)[sVar4] = 0xff;
    if (this->capacity_ == 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = 0;
      do {
        if (this->ctrl_[uVar21] == -2) {
          if ((this->settings_).
              super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
              .value.super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          uVar15 = (*(this->settings_).
                     super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                     .
                     super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                     .value._M_invoker)
                             ((_Any_data *)
                              &(this->settings_).
                               super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                               .
                               super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                              ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (this->slots_ + uVar21));
          auVar23._8_56_ = extraout_var;
          auVar23._0_8_ = extraout_XMM0_Qa;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar15;
          uVar5 = this->capacity_;
          auVar22 = vpcmpeqd_avx(auVar23._0_16_,auVar23._0_16_);
          uVar16 = SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),8) +
                   SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),0);
          pcVar6 = this->ctrl_;
          uVar17 = uVar16 >> 7 & uVar5;
          uVar11 = vpcmpgtb_avx512vl(auVar22,*(undefined1 (*) [16])(pcVar6 + uVar17));
          if ((short)uVar11 == 0) {
            lVar19 = 0x10;
            uVar20 = uVar17;
            do {
              uVar20 = uVar20 + lVar19;
              lVar19 = lVar19 + 0x10;
              uVar20 = uVar20 & uVar5;
              uVar11 = vpcmpgtb_avx512vl(auVar22,*(undefined1 (*) [16])(pcVar6 + uVar20));
            } while ((short)uVar11 == 0);
            uVar18 = (uint)uVar11;
          }
          else {
            uVar18 = (uint)uVar11;
            uVar20 = uVar17;
          }
          uVar12 = 0;
          for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x80000000) {
            uVar12 = uVar12 + 1;
          }
          uVar20 = uVar12 + uVar20 & uVar5;
          bVar14 = (byte)uVar16;
          if (((uVar21 - uVar17 ^ uVar20 - uVar17) & uVar5) < 0x10) {
            bVar14 = bVar14 & 0x7f;
            pcVar6[uVar21] = bVar14;
            this->ctrl_
            [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar21 - 0x10 & this->capacity_)] = bVar14;
          }
          else {
            bVar14 = bVar14 & 0x7f;
            cVar2 = pcVar6[uVar20];
            pcVar6[uVar20] = bVar14;
            this->ctrl_
            [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar20 - 0x10 & this->capacity_)] = bVar14;
            psVar7 = this->slots_;
            if (cVar2 == -0x80) {
              pauVar3 = (undefined1 (*) [16])((long)psVar7 + uVar20 * 0x28 + 0x10);
              psVar9 = psVar7 + uVar20;
              pauVar1 = (undefined1 (*) [16])((long)psVar7 + uVar21 * 0x28 + 0x10);
              *(undefined1 (**) [16])pauVar3[-1] = pauVar3;
              if (*(undefined1 (**) [16])pauVar1[-1] == pauVar1) {
                *pauVar3 = *pauVar1;
              }
              else {
                (psVar9->value).first._M_dataplus._M_p = (pointer)*(undefined1 (**) [16])pauVar1[-1]
                ;
                (psVar9->value).first.field_2._M_allocated_capacity = *(size_type *)*pauVar1;
              }
              psVar7 = psVar7 + uVar21;
              (psVar9->value).first._M_string_length = (psVar7->value).first._M_string_length;
              *(undefined1 (**) [16])psVar7 = pauVar1;
              (psVar7->key)._M_string_length = 0;
              (psVar7->value).first.field_2._M_local_buf[0] = '\0';
              (psVar9->value).second = (psVar7->value).second;
              this->ctrl_[uVar21] = -0x80;
              this->ctrl_
              [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar21 - 0x10 & this->capacity_)] = -0x80
              ;
            }
            else {
              pauVar3 = (undefined1 (*) [16])((long)psVar7 + uVar21 * 0x28 + 0x10);
              if (*(undefined1 (**) [16])pauVar3[-1] == pauVar3) {
                auStack_48 = *pauVar3;
                pauStack_58 = &auStack_48;
              }
              else {
                auStack_48._0_8_ = *(undefined8 *)*pauVar3;
                pauStack_58 = *(undefined1 (**) [16])pauVar3[-1];
              }
              psVar7 = psVar7 + uVar21;
              sVar8 = (psVar7->value).first._M_string_length;
              *(undefined1 (**) [16])psVar7 = pauVar3;
              (psVar7->key)._M_string_length = 0;
              (psVar7->value).first.field_2._M_local_buf[0] = '\0';
              iStack_38 = (psVar7->value).second;
              psVar9 = this->slots_;
              pauVar3 = (undefined1 (*) [16])((long)psVar9 + uVar21 * 0x28 + 0x10);
              pauVar1 = (undefined1 (*) [16])((long)psVar9 + uVar20 * 0x28 + 0x10);
              psVar7 = psVar9 + uVar21;
              *(undefined1 (**) [16])pauVar3[-1] = pauVar3;
              if (*(undefined1 (**) [16])pauVar1[-1] == pauVar1) {
                *pauVar3 = *pauVar1;
              }
              else {
                (psVar7->value).first._M_dataplus._M_p = (pointer)*(undefined1 (**) [16])pauVar1[-1]
                ;
                (psVar7->value).first.field_2._M_allocated_capacity = *(size_type *)*pauVar1;
              }
              psVar9 = psVar9 + uVar20;
              (psVar7->value).first._M_string_length = (psVar9->value).first._M_string_length;
              *(undefined1 (**) [16])psVar9 = pauVar1;
              (psVar9->key)._M_string_length = 0;
              (psVar9->value).first.field_2._M_local_buf[0] = '\0';
              (psVar7->value).second = (psVar9->value).second;
              psVar7 = this->slots_ + uVar20;
              pauVar3 = (undefined1 (*) [16])((long)this->slots_ + uVar20 * 0x28 + 0x10);
              *(undefined1 (**) [16])pauVar3[-1] = pauVar3;
              if (pauStack_58 == &auStack_48) {
                *pauVar3 = auStack_48;
              }
              else {
                (psVar7->value).first._M_dataplus._M_p = (pointer)pauStack_58;
                (psVar7->value).first.field_2._M_allocated_capacity = auStack_48._0_8_;
              }
              uVar21 = uVar21 - 1;
              (psVar7->value).first._M_string_length = sVar8;
              auVar13[0xf] = 0;
              auVar13._0_15_ = auStack_48._1_15_;
              auStack_48 = auVar13 << 8;
              (psVar7->value).second = iStack_38;
            }
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != this->capacity_);
    }
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
    .value = uVar21 - ((uVar21 >> 3) + this->size_);
    return;
  }
  resize(this,uVar21 * 2 + 1);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }